

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O0

void UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  uint uVar2;
  UChar *pUVar3;
  long *plVar4;
  bool bVar5;
  uint uVar6;
  UChar *pUVar7;
  uint32_t leadByte;
  int trailIsOk;
  int leadIsOk;
  UConverterDataHZ *myData;
  int32_t mySourceChar;
  UChar32 targetUniChar;
  char *mySourceLimit;
  UChar *myTarget;
  char *mySource;
  UErrorCode *pUStack_18;
  char tempBuf [2];
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  pUVar3 = (UChar *)args->sourceLimit;
  plVar4 = (long *)args->converter->extraInfo;
  mySourceLimit = (char *)args->target;
  pUVar7 = (UChar *)args->source;
  pUStack_18 = err;
LAB_0038fbaa:
  do {
    myTarget = pUVar7;
    if (pUVar3 <= myTarget) {
LAB_0039002d:
      args->target = (UChar *)mySourceLimit;
      args->source = (char *)myTarget;
      return;
    }
    if (args->targetLimit <= mySourceLimit) {
      *pUStack_18 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0039002d;
    }
    pUVar7 = (UChar *)((long)myTarget + 1);
    bVar1 = (byte)*myTarget;
    uVar6 = (uint)bVar1;
    if (args->converter->mode != 0x7e) {
      if (*(char *)((long)plVar4 + 0x11) == '\0') {
        if (uVar6 != 0x7e) {
          myData._0_4_ = uVar6;
          if (uVar6 < 0x80) {
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            myData._4_4_ = uVar6;
            myTarget = pUVar7;
          }
          else {
            myData._4_4_ = 0xffff;
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            myTarget = pUVar7;
          }
          goto LAB_0038ff35;
        }
        args->converter->mode = 0x7e;
      }
      else if (args->converter->toUnicodeStatus == 0) {
        if (uVar6 == 0x7e) {
          args->converter->mode = 0x7e;
        }
        else {
          args->converter->toUnicodeStatus = uVar6 | 0x100;
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
        }
      }
      else {
        uVar2 = args->converter->toUnicodeStatus;
        myData._0_4_ = uVar2 & 0xff;
        myData._4_4_ = 0xffff;
        bVar5 = 0x5d < (uVar6 - 0x21 & 0xff);
        if ((0x5c < ((uint)myData - 0x21 & 0xff)) || (bVar5)) {
          if (bVar5) {
            myData._0_4_ = (uint)myData << 8 | 0x10000 | uVar6;
            myTarget = pUVar7;
          }
        }
        else {
          mySource._6_1_ = (char)uVar2 + -0x80;
          mySource._7_1_ = bVar1 + 0x80;
          myData._4_4_ = ucnv_MBCSSimpleGetNextUChar_63
                                   (*(UConverterSharedData **)(*plVar4 + 0x30),
                                    (char *)((long)&mySource + 6),2,args->converter->useFallback);
          myData._0_4_ = (uint)myData << 8 | uVar6;
          myTarget = pUVar7;
        }
        args->converter->toUnicodeStatus = 0;
LAB_0038ff35:
        if (0xfffd < (int)myData._4_4_) {
          if (myData._4_4_ == 0xfffe) {
            *pUStack_18 = U_INVALID_CHAR_FOUND;
          }
          else {
            *pUStack_18 = U_ILLEGAL_CHAR_FOUND;
          }
          if ((uint)myData < 0x100) {
            args->converter->toUBytes[0] = (uint8_t)(uint)myData;
            args->converter->toULength = '\x01';
          }
          else {
            args->converter->toUBytes[0] = (uint8_t)((uint)myData >> 8);
            args->converter->toUBytes[1] = (uint8_t)(uint)myData;
            args->converter->toULength = '\x02';
          }
          goto LAB_0039002d;
        }
        if (args->offsets != (int32_t *)0x0) {
          args->offsets[(long)mySourceLimit - (long)args->target >> 1] =
               (((int)myTarget - (int)args->source) + -1) - (int)*(char *)((long)plVar4 + 0x11);
        }
        *(short *)mySourceLimit = (short)myData._4_4_;
        mySourceLimit = mySourceLimit + 2;
        pUVar7 = myTarget;
      }
      goto LAB_0038fbaa;
    }
    args->converter->mode = 0;
    if (uVar6 != 10) {
      if ((uVar6 == 0x7b) || (uVar6 == 0x7d)) {
        *(bool *)((long)plVar4 + 0x11) = uVar6 == 0x7b;
        if (*(char *)((long)plVar4 + 0x13) != '\0') {
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          *pUStack_18 = U_ILLEGAL_ESCAPE_SEQUENCE;
          args->converter->toUCallbackReason = UCNV_IRREGULAR;
          args->converter->toUBytes[0] = '~';
          args->converter->toUBytes[1] = bVar1;
          args->converter->toULength = '\x02';
          args->target = (UChar *)mySourceLimit;
          args->source = (char *)pUVar7;
          return;
        }
        *(undefined1 *)((long)plVar4 + 0x13) = 1;
      }
      else {
        if (uVar6 != 0x7e) {
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          *pUStack_18 = U_ILLEGAL_ESCAPE_SEQUENCE;
          args->converter->toUBytes[0] = '~';
          if (*(char *)((long)plVar4 + 0x11) == '\0') {
            if (0x7f < uVar6) goto LAB_0038fd84;
          }
          else if ((uVar6 < 0x21) || (0x7e < uVar6)) {
LAB_0038fd84:
            args->converter->toUBytes[1] = bVar1;
            args->converter->toULength = '\x02';
            myTarget = pUVar7;
            goto LAB_0038fda0;
          }
          args->converter->toULength = '\x01';
LAB_0038fda0:
          args->target = (UChar *)mySourceLimit;
          args->source = (char *)myTarget;
          return;
        }
        if (args->offsets != (int32_t *)0x0) {
          args->offsets[(long)mySourceLimit - (long)args->target >> 1] =
               ((int)pUVar7 - (int)args->source) + -2;
        }
        *(ushort *)mySourceLimit = (ushort)bVar1;
        *(undefined1 *)((long)plVar4 + 0x13) = 0;
        mySourceLimit = mySourceLimit + 2;
      }
    }
  } while( true );
}

Assistant:

static void  U_CALLCONV
UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    int32_t mySourceChar = 0x0000;
    UConverterDataHZ* myData=(UConverterDataHZ*)(args->converter->extraInfo);
    tempBuf[0]=0; 
    tempBuf[1]=0;

    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < args->target) || (mySourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    
    while(mySource< mySourceLimit){
        
        if(myTarget < args->targetLimit){
            
            mySourceChar= (unsigned char) *mySource++;

            if(args->converter->mode == UCNV_TILDE) {
                /* second byte after ~ */
                args->converter->mode=0;
                switch(mySourceChar) {
                case 0x0A:
                    /* no output for ~\n (line-continuation marker) */
                    continue;
                case UCNV_TILDE:
                    if(args->offsets) {
                        args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 2);
                    }
                    *(myTarget++)=(UChar)mySourceChar;
                    myData->isEmptySegment = FALSE;
                    continue;
                case UCNV_OPEN_BRACE:
                case UCNV_CLOSE_BRACE:
                    myData->isStateDBCS = (mySourceChar == UCNV_OPEN_BRACE);
                    if (myData->isEmptySegment) {
                        myData->isEmptySegment = FALSE; /* we are handling it, reset to avoid future spurious errors */
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toUBytes[0] = UCNV_TILDE;
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                        args->target = myTarget;
                        args->source = mySource;
                        return;
                    }
                    myData->isEmptySegment = TRUE;
                    continue;
                default:
                     /* if the first byte is equal to TILDE and the trail byte
                     * is not a valid byte then it is an error condition
                     */
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     */
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUBytes[0] = UCNV_TILDE;
                    if( myData->isStateDBCS ?
                            (0x21 <= mySourceChar && mySourceChar <= 0x7e) :
                            mySourceChar <= 0x7f
                    ) {
                        /* The current byte could be the start of a character: Back it out. */
                        args->converter->toULength = 1;
                        --mySource;
                    } else {
                        /* Include the current byte in the illegal sequence. */
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                    }
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
            } else if(myData->isStateDBCS) {
                if(args->converter->toUnicodeStatus == 0x00){
                    /* lead byte */
                    if(mySourceChar == UCNV_TILDE) {
                        args->converter->mode = UCNV_TILDE;
                    } else {
                        /* add another bit to distinguish a 0 byte from not having seen a lead byte */
                        args->converter->toUnicodeStatus = (uint32_t) (mySourceChar | 0x100);
                        myData->isEmptySegment = FALSE; /* the segment has something, either valid or will produce a different error, so reset this */
                    }
                    continue;
                }
                else{
                    /* trail byte */
                    int leadIsOk, trailIsOk;
                    uint32_t leadByte = args->converter->toUnicodeStatus & 0xff;
                    targetUniChar = 0xffff;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In HZ DBCS, if the second byte is in the 21..7e range,
                     * we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(leadByte - 0x21) <= (0x7d - 0x21);
                    trailIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        tempBuf[0] = (char) (leadByte+0x80) ;
                        tempBuf[1] = (char) (mySourceChar+0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(myData->gbConverter->sharedData,
                            tempBuf, 2, args->converter->useFallback);
                        mySourceChar= (leadByte << 8) | mySourceChar;
                    } else if (trailIsOk) {
                        /* report a single illegal byte and continue with the following DBCS starter byte */
                        --mySource;
                        mySourceChar = (int32_t)leadByte;
                    } else {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar= 0x10000 | (leadByte << 8) | mySourceChar;
                    }
                    args->converter->toUnicodeStatus =0x00;
                }
            }
            else{
                if(mySourceChar == UCNV_TILDE) {
                    args->converter->mode = UCNV_TILDE;
                    continue;
                } else if(mySourceChar <= 0x7f) {
                    targetUniChar = (UChar)mySourceChar;  /* ASCII */
                    myData->isEmptySegment = FALSE; /* the segment has something valid */
                } else {
                    targetUniChar = 0xffff;
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                }
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 1-(myData->isStateDBCS));
                }

                *(myTarget++)=(UChar)targetUniChar;
            }
            else /* targetUniChar>=0xfffe */ {
                if(targetUniChar == 0xfffe){
                    *err = U_INVALID_CHAR_FOUND;
                }
                else{
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                if(mySourceChar > 0xff){
                    args->converter->toUBytes[0] = (uint8_t)(mySourceChar >> 8);
                    args->converter->toUBytes[1] = (uint8_t)mySourceChar;
                    args->converter->toULength=2;
                }
                else{
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength=1;
                }
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    args->target = myTarget;
    args->source = mySource;
}